

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<float> * __thiscall TPZVec<float>::operator=(TPZVec<float> *this,TPZVec<float> *copy)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this);
    lVar1 = copy->fNElements;
    if (0 < lVar1) {
      pfVar2 = copy->fStore;
      pfVar3 = this->fStore;
      lVar4 = 0;
      do {
        pfVar3[lVar4] = pfVar2[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}